

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O0

bool __thiscall cmRST::ProcessFile(cmRST *this,string *fname,bool isModule)

{
  bool bVar1;
  char *pcVar2;
  string local_260;
  long local_230;
  ifstream fin;
  bool isModule_local;
  string *fname_local;
  cmRST *this_local;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_230,pcVar2,_S_in);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&local_230 + *(long *)(local_230 + -0x18)));
  if (bVar1) {
    cmsys::SystemTools::GetFilenamePath(&local_260,fname);
    std::__cxx11::string::operator=((string *)&this->DocDir,(string *)&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    if (isModule) {
      ProcessModule(this,(istream *)&local_230);
    }
    else {
      ProcessRST(this,(istream *)&local_230);
    }
    this->OutputLinePending = true;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  std::ifstream::~ifstream(&local_230);
  return this_local._7_1_;
}

Assistant:

bool cmRST::ProcessFile(std::string const& fname, bool isModule)
{
  cmsys::ifstream fin(fname.c_str());
  if (fin) {
    this->DocDir = cmSystemTools::GetFilenamePath(fname);
    if (isModule) {
      this->ProcessModule(fin);
    } else {
      this->ProcessRST(fin);
    }
    this->OutputLinePending = true;
    return true;
  }
  return false;
}